

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilingHelpers.cpp
# Opt level: O0

void Js::ProfilingHelpers::ProfiledStElem
               (Var base,Var varIndex,Var value,FunctionBody *functionBody,ProfileId profileId,
               PropertyOperationFlags flags,bool didArrayAccessHelperCall,
               bool bailedOutOnArraySpecialization)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  FldInfoFlags oldFlags;
  FldInfoFlags newFlags;
  uint uVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  DynamicProfileInfo *pDVar7;
  INT_PTR IVar8;
  INT_PTR IVar9;
  RecyclableObject *this;
  bool local_f3;
  bool local_f1;
  byte local_e2;
  bool local_e1;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_ce;
  PropertyCacheOperationInfo local_cc;
  undefined1 local_c9;
  PropertyCacheOperationInfo operationInfo;
  RecyclableObject *pRStack_c8;
  bool result;
  RecyclableObject *object;
  bool isTypedArray;
  PropertyRecordUsageCache *pPStack_b8;
  TypeId instanceType;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  RecyclableObject *cacheOwner;
  uint32 offset;
  int32 index;
  SparseArraySegmentBase *pSStack_98;
  bool isVirtual;
  SparseArraySegmentBase *head;
  uint32 local_88;
  uint32 local_84;
  uint32 headSegmentLength;
  uint32 length;
  TypeId arrayTypeId;
  bool isObjectWithArray;
  JavascriptArray *array;
  JavascriptArray *local_68;
  JavascriptArray *array_1;
  ScriptContext *pSStack_58;
  bool fastPath;
  ScriptContext *scriptContext;
  undefined1 uStack_48;
  bool isJsArray;
  StElemInfo stElemInfo;
  bool bailedOutOnArraySpecialization_local;
  bool didArrayAccessHelperCall_local;
  PropertyOperationFlags flags_local;
  ProfileId profileId_local;
  FunctionBody *functionBody_local;
  Var value_local;
  Var varIndex_local;
  Var base_local;
  TypeId local_18;
  TypeId typeId;
  
  scriptContext._7_1_ = didArrayAccessHelperCall;
  scriptContext._6_1_ = bailedOutOnArraySpecialization;
  _uStack_48 = flags;
  if (base == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0xf1,"(base)","base");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (varIndex == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0xf2,"(varIndex)","varIndex");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (value == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0xf3,"(value)","value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0xf4,"(functionBody)","functionBody");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (profileId == 0xffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                ,0xf5,"(profileId != Constants::NoProfileId)",
                                "profileId != Constants::NoProfileId");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  StElemInfo::StElemInfo((StElemInfo *)((long)&scriptContext + 2));
  if ((scriptContext._6_1_ & 1) != 0) {
    scriptContext._5_1_ = scriptContext._5_1_ & 0xbf | 0x40;
  }
  bVar2 = TaggedNumber::Is(base);
  local_e1 = false;
  if (!bVar2) {
    local_e1 = VirtualTableInfo<Js::JavascriptArray>::HasVirtualTable(base);
  }
  scriptContext._1_1_ = local_e1;
  pSStack_58 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  local_e2 = 0;
  if ((scriptContext._1_1_ & 1) != 0) {
    bVar2 = Js::JavascriptOperators::SetElementMayHaveImplicitCalls(pSStack_58);
    local_e2 = bVar2 ^ 0xff;
  }
  array_1._7_1_ = local_e2 & 1;
  if (array_1._7_1_ != 0) {
    local_68 = UnsafeVarTo<Js::JavascriptArray>(base);
    array._4_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                  ValueType::FromArray(Array,local_68,TypeIds_Array);
    array._6_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                  ValueType::ToLikely((ValueType *)((long)&array + 4));
    scriptContext._2_2_ = array._6_2_;
    bVar2 = Js::JavascriptArray::HasNoMissingValues(local_68);
    scriptContext._5_1_ = scriptContext._5_1_ & 0xfd | bVar2 << 1;
    ProfiledStElem_FastPath
              (local_68,varIndex,value,pSStack_58,_uStack_48,
               (StElemInfo *)((long)&scriptContext + 2));
    bVar2 = Js::JavascriptArray::HasNoMissingValues(local_68);
    scriptContext._5_1_ =
         scriptContext._5_1_ & 0xfd |
         ((scriptContext._5_1_ >> 1 & 1 & (bVar2 ^ 0xffU) & 1) != 0) << 1;
    pDVar7 = FunctionBody::GetDynamicProfileInfo(functionBody);
    DynamicProfileInfo::RecordElementStore
              (pDVar7,functionBody,profileId,(StElemInfo *)((long)&scriptContext + 2));
    return;
  }
  if ((scriptContext._1_1_ & 1) == 0) {
    _arrayTypeId = Js::JavascriptArray::GetArrayForArrayOrObjectWithArray
                             (base,(bool *)((long)&length + 3),&headSegmentLength);
  }
  else {
    _arrayTypeId = UnsafeVarTo<Js::JavascriptArray>(base);
    length._3_1_ = 0;
    headSegmentLength = 0x1d;
  }
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(base);
  if (_arrayTypeId == (JavascriptArray *)0x0) {
    bVar2 = Js::TypedArrayBase::TryGetLengthForOptimizedTypedArray
                      (base,&local_88,&headSegmentLength);
    bVar3 = scriptContext._5_1_;
    if (!bVar2) goto LAB_00ffa4c4;
    local_84 = local_88;
    IVar8 = VirtualTableInfoBase::GetVirtualTable(base);
    IVar9 = ValueType::GetVirtualTypedArrayVtable(headSegmentLength);
    index._3_1_ = IVar8 == IVar9;
    offset._2_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   ValueType::FromTypeId(headSegmentLength,(bool)index._3_1_);
    index._0_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                  ValueType::ToLikely((ValueType *)((long)&offset + 2));
    scriptContext._2_2_ = index._0_2_;
    bVar2 = TaggedNumber::Is(value);
    if ((!bVar2) && (bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(value), !bVar2)) {
      scriptContext._5_1_ = scriptContext._5_1_ & 0xf7 | 8;
    }
  }
  else {
    if ((length._3_1_ & 1) == 0) {
      head._4_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   ValueType::FromArray(Array,_arrayTypeId,headSegmentLength);
    }
    else {
      head._4_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   ValueType::FromObjectArray(_arrayTypeId);
    }
    head._6_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 ValueType::ToLikely((ValueType *)((long)&head + 4));
    scriptContext._2_2_ = head._6_2_;
    bVar2 = Js::JavascriptArray::HasNoMissingValues(_arrayTypeId);
    scriptContext._5_1_ = scriptContext._5_1_ & 0xfd | bVar2 << 1;
    local_84 = ArrayObject::GetLength(&_arrayTypeId->super_ArrayObject);
    pSStack_98 = Js::JavascriptArray::GetHead(_arrayTypeId);
    if (pSStack_98->left != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                  ,0x134,"(head->left == 0)","head->left == 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    local_88 = pSStack_98->length;
  }
  if ((scriptContext._7_1_ & 1) != 0) {
    scriptContext._5_1_ = scriptContext._5_1_ & 0xf7 | 8;
  }
  bVar2 = TaggedInt::Is(varIndex);
  if (bVar2) {
    cacheOwner._4_4_ = TaggedInt::ToInt32(varIndex);
    if ((int)cacheOwner._4_4_ < 0) {
      bVar3 = scriptContext._5_1_ & 0xf7 | 8;
    }
    else {
      cacheOwner._0_4_ = cacheOwner._4_4_;
      if (cacheOwner._4_4_ < local_88) {
        bVar3 = scriptContext._5_1_;
        if ((_arrayTypeId != (JavascriptArray *)0x0) &&
           (uVar4 = (*(_arrayTypeId->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x77])(_arrayTypeId,(ulong)cacheOwner._4_4_),
           bVar3 = scriptContext._5_1_, (uVar4 & 1) != 0)) {
          bVar3 = scriptContext._5_1_ & 0xfb | 4;
        }
      }
      else {
        bVar3 = scriptContext._5_1_ & 0xef | 0x10;
        if (((length._3_1_ & 1) == 0) && (local_84 <= cacheOwner._4_4_)) {
          bVar3 = scriptContext._5_1_ & 0xcf | 0x30;
        }
      }
    }
  }
  else {
    bVar3 = scriptContext._5_1_ & 0xf7 | 8;
  }
LAB_00ffa4c4:
  scriptContext._5_1_ = bVar3;
  if (base == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = TaggedInt::Is(base);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(base);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      this = UnsafeVarTo<Js::RecyclableObject>(base);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_18 = RecyclableObject::GetTypeId(this);
      if ((0x57 < (int)local_18) && (BVar5 = RecyclableObject::IsExternal(this), BVar5 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
  }
  local_f1 = (int)local_18 < 0x2c || 0x34 < (int)local_18;
  if ((local_f1) &&
     (bVar2 = Js::JavascriptOperators::GetPropertyRecordUsageCache
                        (varIndex,pSStack_58,&stack0xffffffffffffff48,
                         (RecyclableObject **)&propertyRecordUsageCache), bVar2)) {
    pRStack_c8 = (RecyclableObject *)0x0;
    local_c9 = Js::JavascriptOperators::GetPropertyObjectForSetElementI
                         (base,propertyRecordUsageCache,pSStack_58,&stack0xffffffffffffff38);
    if (!(bool)local_c9) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ProfilingHelpers.cpp"
                                  ,0x172,"(result)","result");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    PropertyCacheOperationInfo::PropertyCacheOperationInfo(&local_cc);
    Js::JavascriptOperators::SetElementIWithCache<true>
              (base,pRStack_c8,(RecyclableObject *)propertyRecordUsageCache,value,pPStack_b8,
               pSStack_58,_uStack_48,&local_cc);
    oldFlags = DynamicProfileInfo::FldInfoFlagsFromCacheType(local_cc.cacheType);
    scriptContext._4_1_ = oldFlags;
    newFlags = DynamicProfileInfo::FldInfoFlagsFromSlotType(local_cc.slotType);
    scriptContext._4_1_ = DynamicProfileInfo::MergeFldInfoFlags(oldFlags,newFlags);
  }
  else {
    Js::JavascriptOperators::OP_SetElementI(base,varIndex,value,pSStack_58,_uStack_48);
  }
  local_ce.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       StElemInfo::GetArrayType((StElemInfo *)((long)&scriptContext + 2));
  local_f3 = ValueType::IsUninitialized((ValueType *)&local_ce.field_0);
  local_f3 = local_f3 && scriptContext._4_1_ == FldInfo_NoInfo;
  if (local_f3) {
    pDVar7 = FunctionBody::GetDynamicProfileInfo(functionBody);
    DynamicProfileInfo::RecordElementStoreAsProfiled(pDVar7,functionBody,profileId);
  }
  else {
    if (_arrayTypeId != (JavascriptArray *)0x0) {
      bVar2 = Js::JavascriptArray::HasNoMissingValues(_arrayTypeId);
      scriptContext._5_1_ =
           scriptContext._5_1_ & 0xfd |
           ((scriptContext._5_1_ >> 1 & 1 & (bVar2 ^ 0xffU) & 1) != 0) << 1;
    }
    pDVar7 = FunctionBody::GetDynamicProfileInfo(functionBody);
    DynamicProfileInfo::RecordElementStore
              (pDVar7,functionBody,profileId,(StElemInfo *)((long)&scriptContext + 2));
  }
  return;
}

Assistant:

void ProfilingHelpers::ProfiledStElem(
        const Var base,
        const Var varIndex,
        const Var value,
        FunctionBody *const functionBody,
        const ProfileId profileId,
        const PropertyOperationFlags flags,
        bool didArrayAccessHelperCall,
        bool bailedOutOnArraySpecialization)
    {
        JIT_HELPER_REENTRANT_HEADER(ProfiledStElem);
        Assert(base);
        Assert(varIndex);
        Assert(value);
        Assert(functionBody);
        Assert(profileId != Constants::NoProfileId);

        StElemInfo stElemInfo;

        if (bailedOutOnArraySpecialization)
        {
            stElemInfo.disableAggressiveSpecialization = true;
        }

        // Only enable fast path if the javascript array is not cross site
        const bool isJsArray = !TaggedNumber::Is(base) && VirtualTableInfo<JavascriptArray>::HasVirtualTable(base);
        ScriptContext *const scriptContext = functionBody->GetScriptContext();
        const bool fastPath = isJsArray && !JavascriptOperators::SetElementMayHaveImplicitCalls(scriptContext);
        if(fastPath)
        {
            JavascriptArray *const array = UnsafeVarTo<JavascriptArray>(base);
            stElemInfo.arrayType = ValueType::FromArray(ObjectType::Array, array, TypeIds_Array).ToLikely();
            stElemInfo.createdMissingValue = array->HasNoMissingValues();

            ProfiledStElem_FastPath(array, varIndex, value, scriptContext, flags, &stElemInfo);

            stElemInfo.createdMissingValue &= !array->HasNoMissingValues();
            functionBody->GetDynamicProfileInfo()->RecordElementStore(functionBody, profileId, stElemInfo);
            return;
        }

        JavascriptArray *array;
        bool isObjectWithArray;
        TypeId arrayTypeId;
        if(isJsArray)
        {
            array = UnsafeVarTo<JavascriptArray>(base);
            isObjectWithArray = false;
            arrayTypeId = TypeIds_Array;
        }
        else
        {
            array = JavascriptArray::GetArrayForArrayOrObjectWithArray(base, &isObjectWithArray, &arrayTypeId);
        }

#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(base);
#endif

        do // while(false)
        {
            // The fast path is only for JavascriptArray and doesn't cover native arrays, objects with internal arrays, or typed
            // arrays, but we still need to profile the array

            uint32 length;
            uint32 headSegmentLength;
            if(array)
            {
                stElemInfo.arrayType =
                    (
                        isObjectWithArray
                            ? ValueType::FromObjectArray(array)
                            : ValueType::FromArray(ObjectType::Array, array, arrayTypeId)
                    ).ToLikely();
                stElemInfo.createdMissingValue = array->HasNoMissingValues();

                length = array->GetLength();
                SparseArraySegmentBase *const head = array->GetHead();
                Assert(head->left == 0);
                headSegmentLength = head->length;
            }
            else if(TypedArrayBase::TryGetLengthForOptimizedTypedArray(base, &headSegmentLength, &arrayTypeId))
            {
                length = headSegmentLength;
                bool isVirtual = (VirtualTableInfoBase::GetVirtualTable(base) == ValueType::GetVirtualTypedArrayVtable(arrayTypeId));
                stElemInfo.arrayType = ValueType::FromTypeId(arrayTypeId, isVirtual).ToLikely();
                if (!TaggedNumber::Is(value) && !JavascriptNumber::Is_NoTaggedIntCheck(value))
                {
                    // Non-number stored to a typed array. A helper call will be needed to convert the value.
                    stElemInfo.neededHelperCall = true;
                }
            }
            else
            {
                break;
            }

            if (didArrayAccessHelperCall)
            {
                stElemInfo.neededHelperCall = true;
            }

            if(!TaggedInt::Is(varIndex))
            {
                stElemInfo.neededHelperCall = true;
                break;
            }

            const int32 index = TaggedInt::ToInt32(varIndex);
            if(index < 0)
            {
                stElemInfo.neededHelperCall = true;
                break;
            }

            const uint32 offset = index;
            if(offset >= headSegmentLength)
            {
                stElemInfo.storedOutsideHeadSegmentBounds = true;
                if(!isObjectWithArray && offset >= length)
                {
                    stElemInfo.storedOutsideArrayBounds = true;
                }
                break;
            }

            if(array && array->IsMissingHeadSegmentItem(offset))
            {
                stElemInfo.filledMissingValue = true;
            }
        } while(false);

        RecyclableObject* cacheOwner;
        PropertyRecordUsageCache* propertyRecordUsageCache;
        TypeId instanceType = JavascriptOperators::GetTypeId(base);
        bool isTypedArray = (instanceType >= TypeIds_Int8Array && instanceType <= TypeIds_Float64Array);
        if (!isTypedArray && JavascriptOperators::GetPropertyRecordUsageCache(varIndex, scriptContext, &propertyRecordUsageCache, &cacheOwner))
        {
            RecyclableObject* object = nullptr;
            bool result = JavascriptOperators::GetPropertyObjectForSetElementI(base, cacheOwner, scriptContext, &object);
            Assert(result);

            PropertyCacheOperationInfo operationInfo;
            JavascriptOperators::SetElementIWithCache<true /* ReturnOperationInfo */>(base, object, cacheOwner, value, propertyRecordUsageCache, scriptContext, flags, &operationInfo);

            stElemInfo.flags = DynamicProfileInfo::FldInfoFlagsFromCacheType(operationInfo.cacheType);
            stElemInfo.flags = DynamicProfileInfo::MergeFldInfoFlags(stElemInfo.flags, DynamicProfileInfo::FldInfoFlagsFromSlotType(operationInfo.slotType));
        }
        else
        {
            JavascriptOperators::OP_SetElementI(base, varIndex, value, scriptContext, flags);
        }

        if(!stElemInfo.GetArrayType().IsUninitialized() || stElemInfo.flags != Js::FldInfo_NoInfo)
        {
            if(array)
            {
                stElemInfo.createdMissingValue &= !array->HasNoMissingValues();
            }

            functionBody->GetDynamicProfileInfo()->RecordElementStore(functionBody, profileId, stElemInfo);
            return;
        }

        functionBody->GetDynamicProfileInfo()->RecordElementStoreAsProfiled(functionBody, profileId);
        JIT_HELPER_END(ProfiledStElem);
    }